

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

ATMPArgs *
anon_unknown.dwarf_2401980::MemPoolAccept::ATMPArgs::PackageChildWithParents
          (CChainParams *chainparams,int64_t accept_time,
          vector<COutPoint,_std::allocator<COutPoint>_> *coins_to_uncache,
          optional<CFeeRate> *client_maxfeerate)

{
  long lVar1;
  ATMPArgs *in_RDI;
  undefined8 *in_R8;
  long in_FS_OFFSET;
  optional<CFeeRate> in_stack_00000010;
  bool in_stack_ffffffffffffff8c;
  bool in_stack_ffffffffffffff8d;
  bool in_stack_ffffffffffffff8e;
  bool in_stack_ffffffffffffff8f;
  uint in_stack_ffffffffffffff94;
  bool in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ATMPArgs((ATMPArgs *)in_R8[1],(CChainParams *)*in_R8,CONCAT44(in_stack_ffffffffffffffa4,1),
           in_stack_ffffffffffffff9f,
           (vector<COutPoint,_std::allocator<COutPoint>_> *)
           ((ulong)in_stack_ffffffffffffff94 << 0x20),in_stack_ffffffffffffff8f,
           in_stack_ffffffffffffff8e,in_stack_ffffffffffffff8d,in_stack_ffffffffffffff8c,false,
           in_stack_00000010,false);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static ATMPArgs PackageChildWithParents(const CChainParams& chainparams, int64_t accept_time,
                                                std::vector<COutPoint>& coins_to_uncache, const std::optional<CFeeRate>& client_maxfeerate) {
            return ATMPArgs{/* m_chainparams */ chainparams,
                            /* m_accept_time */ accept_time,
                            /* m_bypass_limits */ false,
                            /* m_coins_to_uncache */ coins_to_uncache,
                            /* m_test_accept */ false,
                            /* m_allow_replacement */ true,
                            /* m_allow_sibling_eviction */ false,
                            /* m_package_submission */ true,
                            /* m_package_feerates */ true,
                            /* m_client_maxfeerate */ client_maxfeerate,
                            /* m_allow_carveouts */ false,
            };
        }